

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask1_16(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  
  auVar4 = vpsllvd_avx2(*(undefined1 (*) [32])(in + 1),_DAT_00194060);
  auVar3 = vpsllvd_avx2(*(undefined1 (*) [16])(in + 9),_DAT_00197320);
  auVar1 = vpor_avx(auVar4._0_16_,auVar4._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpor_avx(auVar1,auVar2);
  auVar2 = vpshufd_avx(auVar1,0x55);
  auVar1 = vpor_avx(auVar1,auVar2);
  auVar2 = vpshufd_avx(auVar3,0xee);
  auVar2 = vpor_avx(auVar3,auVar2);
  auVar3 = vpshufd_avx(auVar2,0x55);
  auVar2 = vpor_avx(auVar2,auVar3);
  *out = auVar2._0_4_ | in[0xd] << 0xd | in[0xf] << 0xf | in[0xe] << 0xe | auVar1._0_4_ | *in;
  return out + 1;
}

Assistant:

uint32_t *__fastpackwithoutmask1_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 15;
  ++in;

  return out + 1;
}